

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O1

Real __thiscall
amrex::MLCellLinOp::xdoty
          (MLCellLinOp *this,int param_1,int param_2,MultiFab *x,MultiFab *y,bool local)

{
  int numcomp;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  Real RVar1;
  
  numcomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])
                      (this,CONCAT44(in_register_00000034,param_1),
                       CONCAT44(in_register_00000014,param_2));
  RVar1 = MultiFab::Dot(x,0,y,0,numcomp,0,true);
  return RVar1;
}

Assistant:

Real
MLCellLinOp::xdoty (int /*amrlev*/, int /*mglev*/, const MultiFab& x, const MultiFab& y, bool local) const
{
    const int ncomp = getNComp();
    const int nghost = 0;
    Real result = MultiFab::Dot(x,0,y,0,ncomp,nghost,true);
    if (!local) {
        ParallelAllReduce::Sum(result, ParallelContext::CommunicatorSub());
    }
    return result;
}